

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O1

HT_ErrorCode ht_mutex_destroy(HT_Mutex *mtx)

{
  if (mtx != (HT_Mutex *)0x0) {
    ht_free(mtx);
    return HT_ERR_OK;
  }
  __assert_fail("mtx",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/mutex.cpp",
                0x76,"HT_ErrorCode ht_mutex_destroy(HT_Mutex *)");
}

Assistant:

HT_ErrorCode
ht_mutex_destroy(HT_Mutex* mtx)
{
    HT_ErrorCode err = HT_ERR_OK;

    assert(mtx);

#ifdef HT_MUTEX_IMPL_CPP11
    mtx->mtx.~mutex();
#elif defined(HT_MUTEX_IMPL_POSIX)
    err = pthread_mutex_destroy(&mtx->mtx) == 0 ? HT_ERR_OK : HT_ERR_UNKNOWN;
#elif defined(HT_MUTEX_IMPL_WIN32)
    err = CloseHandle(mtx->mtx) != 0 ? HT_ERR_OK : HT_ERR_UNKNOWN;
#endif

    ht_free(mtx);

    return err;
}